

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blt_mpi_smoke.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined4 local_28;
  int local_24;
  int valueToSend;
  int globalValue;
  int commSize;
  int commRank;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _commSize = argv;
  argv_local._0_4_ = argc;
  MPI_Init(&argv_local,&commSize);
  globalValue = -1;
  MPI_Comm_rank(&ompi_mpi_comm_world,&globalValue);
  valueToSend = -1;
  MPI_Comm_size(&ompi_mpi_comm_world,&valueToSend);
  local_24 = 0;
  local_28 = 1;
  MPI_Reduce(&local_28,&local_24,1,&ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Finalize();
  if (globalValue == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Count should be equal to rank size");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Count = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
    poVar1 = std::operator<<(poVar1,", Size = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,valueToSend);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    if (local_24 != valueToSend) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  // Initialize MPI and get rank and comm size
  MPI_Init(&argc, &argv);

  int commRank = -1;
  MPI_Comm_rank(MPI_COMM_WORLD, &commRank);
  int commSize = -1;
  MPI_Comm_size(MPI_COMM_WORLD, &commSize);

  // Do a basic mpi reduce to determine this actually works
  int globalValue = 0;
  int valueToSend = 1;
  MPI_Reduce(&valueToSend, &globalValue, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);

  // Finalize MPI
  MPI_Finalize();

  if (commRank == 0)
  {
    std::cout << "Count should be equal to rank size" << std::endl;
    std::cout << "Count = " << globalValue << ", Size = " << commSize << std::endl;

    if (globalValue != commSize)
    {
      return 1;
    }
  }

  return 0;
}